

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

make_caster<std::__cxx11::basic_string<char>_> * __thiscall
pybind11::detail::load_type<std::__cxx11::string>
          (make_caster<std::__cxx11::basic_string<char>_> *__return_storage_ptr__,detail *this,
          handle *handle)

{
  handle *handle_local;
  make_caster<std::__cxx11::basic_string<char>_> *conv;
  
  type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::type_caster(__return_storage_ptr__);
  load_type<std::__cxx11::string,void>(__return_storage_ptr__,(handle *)this);
  return __return_storage_ptr__;
}

Assistant:

make_caster<T> load_type(const handle &handle) {
    make_caster<T> conv;
    load_type(conv, handle);
    return conv;
}